

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowOpacity(GLFWwindow *handle,float opacity)

{
  _GLFWwindow *window;
  float opacity_local;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/window.c"
                  ,0x2c1,"void glfwSetWindowOpacity(GLFWwindow *, float)");
  }
  if (NAN(opacity)) {
    __assert_fail("opacity == opacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/window.c"
                  ,0x2c2,"void glfwSetWindowOpacity(GLFWwindow *, float)");
  }
  if (opacity < 0.0) {
    __assert_fail("opacity >= 0.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/window.c"
                  ,0x2c3,"void glfwSetWindowOpacity(GLFWwindow *, float)");
  }
  if (1.0 < opacity) {
    __assert_fail("opacity <= 1.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/window.c"
                  ,0x2c4,"void glfwSetWindowOpacity(GLFWwindow *, float)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((opacity < 0.0) || (1.0 < opacity)) {
    _glfwInputError(0x10004,"Invalid window opacity %f",(double)opacity);
  }
  else {
    _glfwPlatformSetWindowOpacity((_GLFWwindow *)handle,opacity);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowOpacity(GLFWwindow* handle, float opacity)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(opacity == opacity);
    assert(opacity >= 0.f);
    assert(opacity <= 1.f);

    _GLFW_REQUIRE_INIT();

    if (opacity != opacity || opacity < 0.f || opacity > 1.f)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window opacity %f", opacity);
        return;
    }

    _glfwPlatformSetWindowOpacity(window, opacity);
}